

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluka_reader.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Setprecision _Var4;
  _Setiosflags _Var5;
  ostream *poVar6;
  ulong uVar7;
  size_t sVar8;
  long in_RSI;
  int in_EDI;
  int j_1;
  int i_2;
  double a_temp;
  int j;
  int k;
  int i_1;
  double *dati;
  int residuo_ultima_riga;
  int numero_righe;
  int totale_dati;
  int nbin_A;
  double Delta_theta;
  double Theta_max;
  double Theta_min;
  int nbin_E;
  double Delta_E;
  double E_max;
  double E_min;
  double weight;
  char buffer [1025];
  int i;
  bool fallita_apertura_file_out;
  bool fallita_lettura_file_in;
  ofstream output_file;
  istringstream input_file;
  ifstream input1;
  char *in_stack_fffffffffffff488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff490;
  istringstream *in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e4;
  char *in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4f0;
  undefined4 in_stack_fffffffffffff4f4;
  int local_aa8;
  int local_aa4;
  double local_aa0;
  int local_a94;
  int local_a90;
  allocator local_a89;
  string local_a88 [36];
  int local_a64;
  void *local_a60;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  double local_a48;
  double local_a40;
  double local_a38;
  int local_a2c;
  double local_a28;
  double local_a20;
  double local_a18;
  double local_a10;
  char local_a08 [1039];
  allocator local_5f9;
  string local_5f8 [39];
  allocator local_5d1;
  string local_5d0 [32];
  int local_5b0;
  byte local_5aa;
  byte local_5a9;
  ostream local_5a8 [528];
  long local_398 [48];
  char local_218 [520];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 5) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Si usa: ./a.out  -in FILE_IN   -out FILE_OUT");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(0xff);
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::ifstream::ifstream(local_218);
  std::__cxx11::istringstream::istringstream((istringstream *)local_398);
  std::ofstream::ofstream(local_5a8);
  local_5a9 = 1;
  local_5aa = 1;
  for (local_5b0 = 1; local_5b0 < local_8; local_5b0 = local_5b0 + 2) {
    pcVar1 = *(char **)(local_10 + (long)local_5b0 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5d0,pcVar1,&local_5d1);
    bVar3 = std::operator==(in_stack_fffffffffffff490,in_stack_fffffffffffff488);
    std::__cxx11::string::~string(local_5d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
    if (bVar3) {
      std::ifstream::open(local_218,*(undefined8 *)(local_10 + 8 + (long)local_5b0 * 8),8);
      local_5a9 = std::ios::fail();
      local_5a9 = local_5a9 & 1;
    }
    else {
      pcVar1 = *(char **)(local_10 + (long)local_5b0 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f8,pcVar1,&local_5f9);
      bVar3 = std::operator==(in_stack_fffffffffffff490,in_stack_fffffffffffff488);
      std::__cxx11::string::~string(local_5f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
      if (!bVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        poVar6 = std::operator<<(poVar6,*(char **)(local_10 + (long)local_5b0 * 8));
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(0xfe);
      }
      std::ofstream::open(local_5a8,*(undefined8 *)(local_10 + 8 + (long)local_5b0 * 8),0x10);
      local_5aa = std::ios::fail();
      local_5aa = local_5aa & 1;
    }
  }
  if (((local_5a9 & 1) == 0) && ((local_5aa & 1) == 0)) {
    leggi_bene((ifstream *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8,
               (char *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               in_stack_fffffffffffff4d8);
    std::istream::ignore((long)local_398,0x400);
    std::istream::ignore((long)local_398,0x400);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a10);
    leggi_bene((ifstream *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8,
               (char *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               in_stack_fffffffffffff4d8);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a18);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a20);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a2c);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a28);
    leggi_bene((ifstream *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8,
               (char *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               in_stack_fffffffffffff4d8);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a38);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a40);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a4c);
    std::istream::ignore((long)local_398,0x400);
    std::istream::operator>>((istream *)local_398,&local_a48);
    leggi_bene((ifstream *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8,
               (char *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
               in_stack_fffffffffffff4d8);
    local_a50 = local_a2c * local_a4c;
    local_a54 = local_a50 / 10;
    local_a58 = local_a50 % 10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_a50;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    local_a60 = operator_new__(uVar7);
    do {
      std::istream::getline(local_218,(long)local_a08);
      sVar8 = strlen(local_a08);
    } while (sVar8 == 0);
    for (local_a64 = 0; local_a64 < local_a54; local_a64 = local_a64 + 1) {
      std::ios::clear((long)local_398 + *(long *)(local_398[0] + -0x18),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a88,local_a08,&local_a89);
      std::__cxx11::istringstream::str((string *)local_398);
      std::__cxx11::string::~string(local_a88);
      std::allocator<char>::~allocator((allocator<char> *)&local_a89);
      for (local_a90 = 0; local_a90 < 10; local_a90 = local_a90 + 1) {
        std::istream::operator>>
                  ((istream *)local_398,
                   (double *)((long)local_a60 + (long)(local_a90 + local_a64 * 10) * 8));
      }
      std::istream::getline(local_218,(long)local_a08);
    }
    if (local_a58 != 0) {
      for (local_a94 = 0; local_a94 < local_a58; local_a94 = local_a94 + 1) {
        std::istream::operator>>
                  ((istream *)local_398,
                   (double *)((long)local_a60 + (long)(local_a94 + local_a54 * 10) * 8));
      }
    }
    for (local_aa4 = 0; local_aa4 < local_a4c; local_aa4 = local_aa4 + 1) {
      local_aa0 = local_a18;
      for (local_aa8 = 0; local_aa8 < local_a2c; local_aa8 = local_aa8 + 1) {
        _Var4 = std::setprecision(7);
        poVar6 = std::operator<<(local_5a8,_Var4);
        _Var5 = std::setiosflags(_S_scientific);
        poVar6 = std::operator<<(poVar6,_Var5);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_aa0);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_aa0 + local_a28);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a38);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a38 + local_a48);
        poVar6 = std::operator<<(poVar6,"\t");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,*(double *)
                                    ((long)local_a60 + (long)(local_aa4 * local_a2c + local_aa8) * 8
                                    ) * local_a28 * local_a48 * local_a10);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_aa0 = local_a28 + local_aa0;
      }
      local_a38 = local_a48 + local_a38;
    }
    std::ifstream::close();
    std::ofstream::close();
    local_4 = 0;
    std::ofstream::~ofstream(local_5a8);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_398);
    std::ifstream::~ifstream(local_218);
    return local_4;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Unable to open input files");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  exit(0xfd);
}

Assistant:

int main (int argc, char *argv[])
{
	if(argc < 5)
	{
		cerr << "Si usa: ./a.out  -in FILE_IN   -out FILE_OUT" << endl;
		exit(255);
	}

	ifstream input1;
	istringstream input_file;
	ofstream output_file;

	bool fallita_lettura_file_in = true, fallita_apertura_file_out = true;

	for (int i = 1; i < argc; i++)	// * We will iterate over argv[] to get the parameters stored inside.
	{								// * Note that we're starting on 1 because we don't need to know the
									// * path of the program, which is stored in argv[0]
		if (std::string(argv[i]) == "-in")
		{
			input1.open(argv[i+1]);
			fallita_lettura_file_in = input1.fail();
			i++;							// so that we skip in the for cycle the parsing of the <nome-file-particelle>
		}
		else if (std::string(argv[i]) == "-out") 
		{
			output_file.open(argv[i+1]);
			fallita_apertura_file_out = output_file.fail();
			i++;							// so that we skip in the for cycle the parsing of the <nome-file-lattice>
		}
		else
		{
			cerr << "Invalid argument: " << argv[i] << std::endl;
			exit(254);
		}
	}


	if ((fallita_lettura_file_in || fallita_apertura_file_out)) 
	{
		cerr << "Unable to open input files" << endl;
		exit(253);
	}



	char buffer[1025];
	double weight;

	leggi_bene(input1, "total weight", buffer, input_file);

	input_file.ignore(1024, ',');
	input_file.ignore(1024, 'w');
	input_file.ignore(1024, 'f');
	input_file >> weight; // letto il numero di particelle (come double!)

//	output_file << weight << endl;



	leggi_bene(input1, "linear energy binning", buffer, input_file);
	double E_min, E_max, Delta_E;
	int nbin_E;

	input_file.ignore(1024, 'm');
	input_file >> E_min;			// letta energia minima 

	input_file.ignore(1024, 'o');
	input_file >> E_max;			// letta energia massima

	input_file.ignore(1024, ',');
	input_file >> nbin_E;			// letto numero bin energia

	input_file.ignore(1024,'(');
	input_file >> Delta_E;			// letta ampiezza bins

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	output_file << E_min << "\t" << E_max << "\t" << nbin_E << "\t" << Delta_E << endl;
	**************************************/



	leggi_bene(input1, "linear angular binning", buffer, input_file);
	double Theta_min, Theta_max, Delta_theta;
	int nbin_A;

	input_file.ignore(1024, 'm');
	input_file >> Theta_min;		// letto angolo minimo 

	input_file.ignore(1024, 'o');
	input_file >> Theta_max;		// letto angolo massimo

	input_file.ignore(1024, ',');
	input_file >> nbin_A;			// letto numero bin angolo

	input_file.ignore(1024, '(');
	input_file >> Delta_theta;		// letta ampiezza bins angolari

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	output_file << Theta_min << "\t" << Theta_max << "\t" << nbin_A << "\t" << Delta_theta << endl;
	**************************************/
  

	leggi_bene(input1, "follow in a matrix", buffer, input_file);

	int totale_dati = nbin_E * nbin_A;
	int numero_righe = totale_dati / 10;
	int residuo_ultima_riga = totale_dati % 10;
	double *dati = new double[totale_dati];

	// saltiamo tutte le righe vuote
	do
		input1.getline(buffer, 1025);
	while(!strlen(buffer));


	for (int i = 0; i < numero_righe; i++)
	{
		input_file.clear();
		input_file.str(buffer);

		for(int k = 0; k < 10; k++)
		{
			input_file >> dati[i*10 + k];
		}

		input1.getline(buffer, 1025);
	}

	if (residuo_ultima_riga)
	{
		for (int j = 0; j < residuo_ultima_riga; j++)
		{
			input_file >> dati[numero_righe*10 + j];
		}
	}

	/**************************************
	// RE-ENABLE IF YOU WANT TO USE THE OLD usrbdx_binning TOOL - now it's included here!
	for(int k=0; k < totale_dati; k++)
	{
		cout << setprecision(4) << setiosflags(ios::scientific) << dati[k] << ' ';
		if (!((k+1) % 10)) cout << endl;
	}
	**************************************/

	double 	a_temp = E_min;

	for (int i = 0; i < nbin_A; i++)
	{
		for (int j = 0; j < nbin_E; j++)
		{
			output_file << setprecision(7) << setiosflags(ios::scientific) << a_temp << "\t" 
						<< a_temp+Delta_E << "\t" << Theta_min << "\t" << Theta_min+Delta_theta << "\t" << dati[i*nbin_E + j]*Delta_E*Delta_theta*weight << endl;
			a_temp += Delta_E;
		}
		a_temp = E_min;
		Theta_min += Delta_theta;
	}


	input1.close();
	output_file.close();
	return 0;

}